

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

void Au_NtkCleanCopy(Au_Ntk_t *p)

{
  Vec_IntFill(&p->vCopies,(p->vPages).nSize * 0x1000 + p->iHandle + -0x1000,-1);
  return;
}

Assistant:

void Au_NtkCleanCopy( Au_Ntk_t * p )
{
    Vec_IntFill( &p->vCopies, Au_NtkObjNumMax(p), -1 );
}